

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

int __thiscall
fmt::anon_unknown_1::PrecisionHandler::visit_any_int<long_long>
          (PrecisionHandler *this,longlong value)

{
  bool bVar1;
  CStringRef message;
  longlong in_RSI;
  FormatError *in_stack_ffffffffffffffc8;
  BasicCStringRef<char> local_18;
  longlong local_10;
  
  local_10 = in_RSI;
  bVar1 = IntChecker<true>::fits_in_int<long_long>(in_RSI);
  if (!bVar1) {
    message.data_ = (char *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_18,"number is too big");
    FormatError::FormatError(in_stack_ffffffffffffffc8,message);
    __cxa_throw(message.data_,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return (int)local_10;
}

Assistant:

int visit_any_int(T value) {
    if (!IntChecker<std::numeric_limits<T>::is_signed>::fits_in_int(value))
      FMT_THROW(FormatError("number is too big"));
    return static_cast<int>(value);
  }